

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::unaligned_dense_assignment_loop<false>::
     run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>>,Eigen::internal::assign_op<float,float>,0>>
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *kernel,Index start,Index end)

{
  DstEvaluatorType *pDVar1;
  SrcEvaluatorType *pSVar2;
  
  pDVar1 = kernel->m_dst;
  pSVar2 = kernel->m_src;
  for (; start < end; start = start + 1) {
    (pDVar1->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>).m_d.
    data[start] = SQRT((pSVar2->
                       super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_float>
                       ).m_d.argImpl.
                       super_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                       .
                       super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_float>
                       .
                       super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                       .m_argImpl.
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                       .m_d.data[start]);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE void run(Kernel &kernel,
                                      Index start,
                                      Index end)
#endif
  {
    for (Index index = start; index < end; ++index)
      kernel.assignCoeff(index);
  }